

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::ContextArray::subdata(ContextArray *this,Target target,int offset,int size,char *ptr)

{
  Context *pCVar1;
  GLenum GVar2;
  deUint32 dVar3;
  char *ptr_local;
  int size_local;
  int offset_local;
  Target target_local;
  ContextArray *this_local;
  
  this->m_target = target;
  if (this->m_storage == STORAGE_BUFFER) {
    pCVar1 = this->m_ctx;
    GVar2 = targetToGL(target);
    (*pCVar1->_vptr_Context[0x25])(pCVar1,(ulong)GVar2,(ulong)this->m_glBuffer);
    dVar3 = (*this->m_ctx->_vptr_Context[0x79])();
    glu::checkError(dVar3,"glBindBuffer()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsVertexArrayTests.cpp"
                    ,0x209);
    pCVar1 = this->m_ctx;
    GVar2 = targetToGL(target);
    (*pCVar1->_vptr_Context[0x29])(pCVar1,(ulong)GVar2,(long)offset,(long)size,ptr);
    dVar3 = (*this->m_ctx->_vptr_Context[0x79])();
    glu::checkError(dVar3,"glBufferSubData()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsVertexArrayTests.cpp"
                    ,0x20c);
  }
  else if (this->m_storage == STORAGE_USER) {
    memcpy(this->m_data + offset,ptr,(long)size);
  }
  return;
}

Assistant:

void ContextArray::subdata (Target target, int offset, int size, const char* ptr)
{
	m_target = target;

	if (m_storage == STORAGE_BUFFER)
	{
		m_ctx.bindBuffer(targetToGL(target), m_glBuffer);
		GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glBindBuffer()");

		m_ctx.bufferSubData(targetToGL(target), offset, size, ptr);
		GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glBufferSubData()");
	}
	else if (m_storage == STORAGE_USER)
		std::memcpy(m_data + offset, ptr, size);
	else
		DE_ASSERT(false);
}